

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::FunctionObject::unary<double,_tcu::Matrix<double,_2,_2>_>::call
          (unary<double,_tcu::Matrix<double,_2,_2>_> *this,GLvoid *result_dst,GLvoid *argument_src)

{
  functionPointer p_function;
  undefined1 local_48 [8];
  Matrix<double,_2,_2> arg;
  double result;
  GLvoid *argument_src_local;
  GLvoid *result_dst_local;
  unary<double,_tcu::Matrix<double,_2,_2>_> *this_local;
  
  tcu::Matrix<double,_2,_2>::Matrix((Matrix<double,_2,_2> *)local_48);
  unpack<tcu::Matrix<double,_2,_2>_>::get(argument_src,(Matrix<double,_2,_2> *)local_48);
  arg.m_data.m_data[1].m_data[1] =
       (double)(*(code *)(this->super_unaryBase).super_functionObject.m_p_function)(local_48);
  pack<double>::set(result_dst,arg.m_data.m_data[1].m_data + 1);
  tcu::Matrix<double,_2,_2>::~Matrix((Matrix<double,_2,_2> *)local_48);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}